

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O1

back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __thiscall
utf8::
utf8to32<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (utf8 *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,
          back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> result)

{
  iterator __position;
  uint32_t local_2c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  if (this != (utf8 *)start._M_current) {
    local_28._M_current = (char *)this;
    do {
      local_2c = next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(&local_28,start);
      __position._M_current = *(uint **)(end._M_current + 8);
      if (__position._M_current == *(uint **)(end._M_current + 0x10)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)end._M_current,__position,
                   &local_2c);
      }
      else {
        *__position._M_current = local_2c;
        *(long *)(end._M_current + 8) = *(long *)(end._M_current + 8) + 4;
      }
    } while (local_28._M_current != start._M_current);
  }
  return (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)end._M_current;
}

Assistant:

u32bit_iterator utf8to32 (octet_iterator start, octet_iterator end, u32bit_iterator result)
    {
        while (start != end)
            (*result++) = utf8::next(start, end);

        return result;
    }